

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

void __thiscall NaPetriNet::add(NaPetriNet *this,NaPetriNode *pNode)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  NaPetriConnector *pNVar7;
  char *pcVar8;
  int i;
  int iVar9;
  char *pcVar10;
  NaPetriNode *pNode_local;
  
  pNode_local = pNode;
  bVar2 = ask_for_node(this,pNode,(int *)0x0);
  if (!bVar2) {
    if (this->fpDig != (FILE *)0x0) {
      iVar3 = NaPetriNode::connectors(pNode);
      if (0 < iVar3) {
        pFVar1 = (FILE *)this->fpDig;
        pcVar5 = NaPetriNode::name(pNode);
        pcVar6 = NaPetriNode::name(pNode);
        fprintf(pFVar1,"  %s [\n    label=\"%s|{",pcVar5,pcVar6);
        iVar9 = 0;
        iVar3 = 0;
        while( true ) {
          iVar4 = NaPetriNode::connectors(pNode);
          if (iVar4 <= iVar9) break;
          pNVar7 = NaPetriNode::connector(pNode,iVar9);
          iVar4 = (*pNVar7->_vptr_NaPetriConnector[7])(pNVar7);
          if (iVar4 == 0) {
            pFVar1 = (FILE *)this->fpDig;
            pcVar5 = NaPetriConnector::name(pNVar7);
            pcVar6 = NaPetriConnector::name(pNVar7);
            pcVar10 = "|<%s>%s";
            if (iVar3 == 0) {
              pcVar10 = "{<%s>%s";
            }
            fprintf(pFVar1,pcVar10,pcVar5,pcVar6);
            iVar3 = iVar3 + 1;
          }
          iVar9 = iVar9 + 1;
        }
        if (0 < iVar3) {
          fputc(0x7d,(FILE *)this->fpDig);
        }
        pcVar5 = "|{<%s>%s";
        if (iVar3 == 0) {
          pcVar5 = "{<%s>%s";
        }
        iVar3 = 0;
        iVar9 = 0;
        while( true ) {
          iVar4 = NaPetriNode::connectors(pNode);
          if (iVar4 <= iVar9) break;
          pNVar7 = NaPetriNode::connector(pNode,iVar9);
          iVar4 = (*pNVar7->_vptr_NaPetriConnector[7])(pNVar7);
          if (iVar4 == 1) {
            pFVar1 = (FILE *)this->fpDig;
            pcVar10 = NaPetriConnector::name(pNVar7);
            pcVar8 = NaPetriConnector::name(pNVar7);
            pcVar6 = "|<%s>%s";
            if (iVar3 == 0) {
              pcVar6 = pcVar5;
            }
            fprintf(pFVar1,pcVar6,pcVar10,pcVar8);
            iVar3 = iVar3 + 1;
          }
          iVar9 = iVar9 + 1;
        }
        if (0 < iVar3) {
          fputc(0x7d,(FILE *)this->fpDig);
        }
        fwrite("}\"\n  ] ;\n",9,1,(FILE *)this->fpDig);
      }
    }
    pcVar5 = this->szName;
    pcVar6 = NaPetriNode::name(pNode);
    NaPrintLog(" %s: + %s node\n",pcVar5,pcVar6);
    NaDynAr<NaPetriNode_*>::addh(&this->pnaNet,&pNode_local);
    pNode_local->pNet = this;
    (*pNode_local->_vptr_NaPetriNode[10])();
  }
  return;
}

Assistant:

void
NaPetriNet::add (NaPetriNode* pNode)
{
    if(ask_for_node(pNode)){
        // Don't add the same node twice
        return;
    }

    if(NULL != fpDig) {
	if(pNode->connectors() > 0) {
	    fprintf(fpDig, "  %s [\n    label=\"%s|{",
		    pNode->name(), pNode->name());
	    int nInputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckInput == pCn->kind()) {
		    if(0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nInputs;
		}
	    }
	    if(nInputs > 0)
		fprintf(fpDig, "}");
	    int nOutputs = 0;
	    for(int i = 0; i < pNode->connectors(); ++i) {
		NaPetriConnector *pCn = pNode->connector(i);
		if(pckOutput == pCn->kind()) {
		    if(0 == nOutputs && 0 == nInputs)
			fprintf(fpDig, "{<%s>%s", pCn->name(), pCn->name());
		    else if(0 == nOutputs)
			fprintf(fpDig, "|{<%s>%s", pCn->name(), pCn->name());
		    else
			fprintf(fpDig, "|<%s>%s", pCn->name(), pCn->name());
		    ++nOutputs;
		}
	    }
	    if(nOutputs > 0)
		fprintf(fpDig, "}");
	    fprintf(fpDig, "}\"\n  ] ;\n");
	}
    }

    NaPrintLog(" %s: + %s node\n", name(), pNode->name());

    pnaNet.addh(pNode);

    // Setup pointer to the network
    pNode->pNet = this;

    // Perform some actions in new attendee
    pNode->attend_network();
}